

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O1

vec3 __thiscall polyscope::SlicePlane::getCenter(SlicePlane *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar4;
  vec3 vVar5;
  vec3 vVar6;
  
  bVar3 = (this->active).value;
  aVar4.z = (uint)(bVar3 & 1) * (this->objectTransform).value.value[3].field_2;
  if (bVar3 == false) {
    vVar5._0_8_ = SUB648(ZEXT464(0x7f800000),0);
    vVar5.field_2 = aVar4;
    return vVar5;
  }
  uVar1 = (this->objectTransform).value.value[3].field_0;
  uVar2 = (this->objectTransform).value.value[3].field_1;
  vVar6.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)uVar2;
  vVar6.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)uVar1;
  vVar6.field_2 = aVar4;
  return vVar6;
}

Assistant:

glm::vec3 SlicePlane::getCenter() {
  if (active.get()) {
    glm::vec3 center{objectTransform.get()[3][0], objectTransform.get()[3][1], objectTransform.get()[3][2]};
    return center;
  } else {
    // Put it really far away so tests always pass
    return glm::vec3{std::numeric_limits<float>::infinity(), 0., 0.};
  }
}